

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_function_wrapper.cpp
# Opt level: O3

void __thiscall
cpp_bindgen::anon_unknown_0::wrap_array_descriptor_Test::TestBody(wrap_array_descriptor_Test *this)

{
  bool bVar1;
  enable_if_t<std::is_lvalue_reference<int_(&)[2][3]>::value_&&_std::is_array<remove_reference_t<int_(&)[2][3]>_>::value_&&_std::is_arithmetic<remove_all_extents_t<remove_reference_t<int_(&)[2][3]>_>_>::value,_int_(&)[2][3]>
  paaiVar2;
  char *message;
  AssertionResult gtest_ar;
  int array [2] [3];
  Message local_88;
  AssertHelper local_80;
  internal local_78 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  int local_68 [8];
  bindgen_fortran_array_descriptor local_48;
  
  local_68[0] = 1;
  local_68[1] = 2;
  local_68[2] = 3;
  local_68[3] = 4;
  local_68[4] = 5;
  local_68[5] = 6;
  local_48.type = bindgen_fk_Int;
  local_48.rank = 2;
  local_48.dims[0] = 3;
  local_48.dims[1] = 2;
  local_48.is_acc_present = false;
  local_48.data = local_68;
  paaiVar2 = make_fortran_array_view<int(&)[2][3]>(&local_48);
  local_88.ss_.ptr_._0_4_ = (*paaiVar2)[0][0];
  testing::internal::CmpHelperEQ<int,int>
            (local_78,"array[0][0]","get(&descriptor, 0, 0)",local_68,(int *)&local_88);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message(&local_88);
    if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_70.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_function_wrapper.cpp"
               ,0x8c,message);
    testing::internal::AssertHelper::operator=(&local_80,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (CONCAT44(local_88.ss_.ptr_._4_4_,(int)local_88.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_88.ss_.ptr_._4_4_,(int)local_88.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_88.ss_.ptr_._4_4_,(int)local_88.ss_.ptr_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(wrap, array_descriptor) {
            int array[2][3] = {{1, 2, 3}, {4, 5, 6}};
            bindgen_fortran_array_descriptor descriptor;
            descriptor.data = array;
            descriptor.type = bindgen_fk_Int;
            descriptor.rank = 2;
            descriptor.dims[0] = 3;
            descriptor.dims[1] = 2;
            descriptor.is_acc_present = false;

            auto get = wrap<int(int(&)[2][3], size_t, size_t)>(
                [](int(&array)[2][3], size_t i, size_t j) { return array[i][j]; });
            EXPECT_EQ(array[0][0], get(&descriptor, 0, 0));
        }